

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzDD::ArchiveIN(ChNodeFEAxyzDD *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::fea::ChNodeFEAxyzDD>(marchive);
  ChNodeFEAxyzD::ArchiveIN(&this->super_ChNodeFEAxyzD,marchive);
  local_30._value = (ChVector<double> *)&(this->super_ChNodeFEAxyzD).field_0x140;
  local_30._name = "DD";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->DD_dt;
  local_48._name = "DD_dt";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->DD_dtdt;
  local_60._name = "DD_dtdt";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChNodeFEAxyzDD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzDD>();
    // deserialize parent class
    ChNodeFEAxyzD::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(DD);
    marchive >> CHNVP(DD_dt);
    marchive >> CHNVP(DD_dtdt);
}